

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar4;
  char *pcVar5;
  char *pcVar6;
  unsigned_long uVar7;
  char *__last;
  ulong uVar8;
  char *__last_00;
  char buffer [17];
  char local_48 [24];
  
  uVar3 = 2;
  uVar7 = value;
  __last = local_48;
  __last_00 = local_48;
  do {
    pcVar5 = __last_00;
    pcVar6 = __last;
    __last = pcVar6 + 1;
    __last_00 = pcVar5 + 1;
    uVar3 = uVar3 + 1;
    bVar2 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar2);
  if (specs == (basic_format_specs<char> *)0x0) {
    if ((out.container)->capacity_ < (out.container)->size_ + 1) {
      (**(out.container)->_vptr_buffer)(out.container);
    }
    sVar1 = (out.container)->size_;
    (out.container)->size_ = sVar1 + 1;
    (out.container)->ptr_[sVar1] = '0';
    if ((out.container)->capacity_ < (out.container)->size_ + 1) {
      (**(out.container)->_vptr_buffer)(out.container);
    }
    sVar1 = (out.container)->size_;
    (out.container)->size_ = sVar1 + 1;
    (out.container)->ptr_[sVar1] = 'x';
    do {
      *pcVar6 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar6 = pcVar6 + -1;
      bVar2 = 0xf < value;
      value = value >> 4;
    } while (bVar2);
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (local_48,__last,out);
  }
  else {
    uVar8 = 0;
    if (uVar3 <= (uint)specs->width) {
      uVar8 = (uint)specs->width - uVar3;
    }
    uVar3 = uVar8 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar4 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar3,&specs->fill);
    if ((bVar4.container)->capacity_ < (bVar4.container)->size_ + 1) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
    }
    sVar1 = (bVar4.container)->size_;
    (bVar4.container)->size_ = sVar1 + 1;
    (bVar4.container)->ptr_[sVar1] = '0';
    if ((bVar4.container)->capacity_ < (bVar4.container)->size_ + 1) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
    }
    sVar1 = (bVar4.container)->size_;
    (bVar4.container)->size_ = sVar1 + 1;
    (bVar4.container)->ptr_[sVar1] = 'x';
    do {
      *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar5 = pcVar5 + -1;
      bVar2 = 0xf < value;
      value = value >> 4;
    } while (bVar2);
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (local_48,__last_00,bVar4);
    bVar4 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (bVar4,uVar8 - uVar3,&specs->fill);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar4.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}